

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O3

bool TestHashList<unsigned_long>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes,bool drawDiagram,
               bool testCollision,bool testDist,bool testHighBits,bool testLowBits)

{
  pointer puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  long lVar10;
  undefined7 in_register_00000031;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  unsigned_long uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  HashSet<unsigned_long> collisions;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  double local_78;
  uint local_70;
  uint local_6c;
  double local_68;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  uVar11 = CONCAT71(in_register_00000031,drawDiagram);
  uVar12 = CONCAT71(in_register_00000009,testDist);
  bVar2 = true;
  if ((int)CONCAT71(in_register_00000011,testCollision) != 0) {
    local_70 = (uint)uVar12;
    local_6c = (uint)uVar11;
    iVar7 = (int)((ulong)((long)(hashes->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(hashes->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    local_78 = (double)iVar7;
    local_68 = local_78 * (double)(iVar7 + -1);
    dVar15 = ldexp(1.0,0x40);
    auVar16._0_8_ = local_68 / dVar15;
    auVar16._8_8_ = 0;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_78;
    auVar16 = vminsd_avx(auVar17,auVar16);
    local_78 = auVar16._0_8_;
    printf("Testing collisions (%3i-bit)     - Expected %12.1f, ",0x40);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar8 = FindCollisions<unsigned_long>(hashes,(HashSet<unsigned_long> *)&local_60,1000);
    printf("actual %6i (%.2fx)",(ulong)uVar8);
    bVar2 = (int)uVar8 < 1;
    if (!bVar2) {
      printf(" !!!!!");
    }
    putchar(10);
    if (testHighBits) {
      bVar2 = CountHighbitsCollisions<unsigned_long>(hashes,0x20);
      bVar3 = TestHighbitsCollisions<unsigned_long>(hashes);
      bVar4 = CountHighbitsCollisions<unsigned_long>(hashes,0xc);
      bVar5 = CountHighbitsCollisions<unsigned_long>(hashes,8);
      bVar2 = ((bVar4 && bVar5) && (bVar2 && bVar3)) && (int)uVar8 < 1;
    }
    if (testLowBits) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_98,hashes);
      puVar1 = local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar9 = (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar10 = 0;
        do {
          uVar12 = local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar10];
          lVar13 = 0x40;
          uVar14 = 0;
          do {
            uVar8 = (uint)uVar12;
            uVar12 = uVar12 >> 1;
            lVar13 = lVar13 + -1;
            uVar14 = (ulong)(uVar8 & 1) + uVar14 * 2;
          } while (lVar13 != 0);
          local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10] = uVar14;
          lVar10 = lVar10 + 1;
        } while (lVar10 != lVar9 + (ulong)(lVar9 == 0));
        if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar9) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar1,local_98.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
        }
      }
      bVar3 = CountLowbitsCollisions<unsigned_long>(&local_98,0x20);
      bVar4 = TestLowbitsCollisions<unsigned_long>(&local_98);
      bVar5 = CountLowbitsCollisions<unsigned_long>(&local_98,0xc);
      bVar6 = CountLowbitsCollisions<unsigned_long>(&local_98,8);
      puVar1 = local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
        if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      bVar2 = (bool)((bVar4 && bVar5) & bVar2 & bVar3 & bVar6);
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&local_60);
    uVar11 = (ulong)local_6c;
    uVar12 = (ulong)local_70;
  }
  if ((char)uVar12 != '\0') {
    bVar3 = TestDistribution<unsigned_long>(hashes,SUB81(uVar11,0));
    bVar2 = bVar2 != false && bVar3;
  }
  return bVar2;
}

Assistant:

bool TestHashList ( std::vector<hashtype> & hashes, bool drawDiagram,
                    bool testCollision = true, bool testDist = true,
                    bool testHighBits = true, bool testLowBits = true )
{
  bool result = true;

  if(testCollision)
  {
    size_t count = hashes.size();
    double expected = EstimateNbCollisions(count, sizeof(hashtype) * 8);
    printf("Testing collisions (%3i-bit)     - Expected %12.1f, ",
           (int)sizeof(hashtype)*8, expected);

    double collcount = 0;
    HashSet<hashtype> collisions;
    collcount = FindCollisions(hashes, collisions, 1000);
    printf("actual %6i (%.2fx)", (int)collcount, collcount / expected);

    if(sizeof(hashtype) == sizeof(uint32_t))
    {
    // 2x expected collisions = fail

    // #TODO - collision failure cutoff needs to be expressed as a standard deviation instead
    // of a scale factor, otherwise we fail erroneously if there are a small expected number
    // of collisions

        if(double(collcount) / double(expected) > 2.0)
        {
          printf(" !!!!!");
          result = false;
        }
    }
    else
    {
      // For all hashes larger than 32 bits, _any_ collisions are a failure.

      if(collcount > 0)
      {
        printf(" !!!!!");
        result = false;
        //if(drawDiagram) PrintCollisions(hashes, collisions);
      }
    }

    printf("\n");

    if (testHighBits) {
      result &= CountHighbitsCollisions(hashes, 256);
      result &= CountHighbitsCollisions(hashes, 128);
      result &= CountHighbitsCollisions(hashes,  64);
      result &= CountHighbitsCollisions(hashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountHighbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestHighbitsCollisions(hashes);
      result &= CountHighbitsCollisions(hashes,   12);
      result &= CountHighbitsCollisions(hashes,   8);
    }
    if (testLowBits) {
      // reverse: bitwise flip the hashes. lowest bits first
      std::vector<hashtype> revhashes = hashes;
      for (size_t i = 0; i < revhashes.size(); i++) {
        revhashes[i] = bitreverse(revhashes[i]);
      }
      std::sort(revhashes.begin(), revhashes.end());

      result &= CountLowbitsCollisions(revhashes, 128);
      result &= CountLowbitsCollisions(revhashes,  64);
      result &= CountLowbitsCollisions(revhashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountLowbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestLowbitsCollisions(revhashes);
      result &= CountLowbitsCollisions(revhashes,   12);
      result &= CountLowbitsCollisions(revhashes,   8);

      std::vector<hashtype>().swap(revhashes);
      //revhashes.clear();
    }
  }


  //----------

  if(testDist)
  {
    result &= TestDistribution(hashes,drawDiagram);
  }

  return result;
}